

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

void HighsHashHelpers::sparse_combine(u64 *hash,HighsInt index,u64 value)

{
  u64 uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = modexp_M61(*(ulong *)(&DAT_003d0bf0 + (ulong)(index & 0x3f) * 8) & 0x1fffffffffffffff,
                     ((ulong)(long)index >> 6) + 1);
  uVar1 = multiply_modM61((value * 2 & 0x1ffffffffffffffe) + 1,uVar1);
  uVar2 = (uVar1 + *hash & 0x1fffffffffffffff) + (uVar1 + *hash >> 0x3d);
  uVar3 = uVar2 + 0xe000000000000001;
  if (uVar2 < 0x1fffffffffffffff) {
    uVar3 = uVar2;
  }
  *hash = uVar3;
  return;
}

Assistant:

static void sparse_combine(u64& hash, HighsInt index, u64 value) {
    // we take each value of the sparse hash as coefficient for a polynomial
    // of the finite field modulo the mersenne prime 2^61-1 where the monomial
    // for a sparse entry has the degree of its index. We evaluate the
    // polynomial at a random constant. This allows to compute the hashes of
    // sparse vectors independently of each others nonzero contribution and
    // therefore allows to use the order of best access patterns for cache
    // performance. E.g. we can compute a strong hash value for parallel row and
    // column detection and only need to loop over the nonzeros once in
    // arbitrary order. This comes at the expense of more expensive hash
    // calculations as it would be more efficient to evaluate the polynomial
    // with horners scheme, but allows for parallelization and arbitrary order.
    // Since we have 64 random constants available, we slightly improve
    // the scheme by using a lower degree polynomial with 64 variables
    // which we evaluate at the random vector of 64.

    // make sure input value is never zero and at most 61bits are used
    value = ((value << 1) & M61()) | 1;

    // make sure that the constant has at most 61 bits, as otherwise the modulo
    // algorithm for multiplication mod M61 might not work properly due to
    // overflow
    u64 a = c[index & 63] & M61();
    u64 degree = (static_cast<u64>(index) >> 6) + 1;

    hash += multiply_modM61(value, modexp_M61(a, degree));
    hash = (hash >> 61) + (hash & M61());
    if (hash >= M61()) hash -= M61();
    assert(hash < M61());
  }